

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::InputFile::initialize(InputFile *this)

{
  InputPartData *pIVar1;
  element_type *peVar2;
  _Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_> __ptr;
  _Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
  __ptr_00;
  _Tuple_impl<0UL,_Imf_3_4::DeepScanLineInputFile_*,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
  __ptr_01;
  _Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
  _Var3;
  exr_storage_t eVar4;
  _Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_> this_00
  ;
  _Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
  this_01;
  _Tuple_impl<0UL,_Imf_3_4::DeepScanLineInputFile_*,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
  this_02;
  _Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
  this_03;
  char *pcVar5;
  ostream *poVar6;
  ArgExc *this_04;
  int partidx;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  pIVar1 = ((this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->_part;
  if (pIVar1 == (InputPartData *)0x0) {
    partidx = 0;
  }
  else {
    partidx = pIVar1->partNumber;
  }
  eVar4 = Context::storage(&this->_ctxt,partidx);
  peVar2 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->_storage = eVar4;
  switch(eVar4) {
  case EXR_STORAGE_SCANLINE:
    this_01.super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl =
         (_Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>)operator_new(0x20);
    ScanLineInputFile::ScanLineInputFile
              ((ScanLineInputFile *)
               this_01.super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl,
               peVar2->_part);
    __ptr_00.super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl =
         (peVar2->_sFile)._M_t.
         super___uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
         .super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>;
    (peVar2->_sFile)._M_t.
    super___uniq_ptr_impl<Imf_3_4::ScanLineInputFile,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::ScanLineInputFile_*,_std::default_delete<Imf_3_4::ScanLineInputFile>_>
    .super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false> =
         this_01.super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl !=
        (ScanLineInputFile *)0x0) {
      std::default_delete<Imf_3_4::ScanLineInputFile>::operator()
                ((default_delete<Imf_3_4::ScanLineInputFile> *)&peVar2->_sFile,
                 (ScanLineInputFile *)
                 __ptr_00.super__Head_base<0UL,_Imf_3_4::ScanLineInputFile_*,_false>._M_head_impl);
      return;
    }
    break;
  case EXR_STORAGE_TILED:
  case EXR_STORAGE_DEEP_TILED:
    this_00.super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl =
         (_Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>)operator_new(0x20);
    TiledInputFile::TiledInputFile
              ((TiledInputFile *)
               this_00.super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl,
               peVar2->_part);
    __ptr.super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl =
         (peVar2->_tFile)._M_t.
         super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
         .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>;
    (peVar2->_tFile)._M_t.
    super___uniq_ptr_impl<Imf_3_4::TiledInputFile,_std::default_delete<Imf_3_4::TiledInputFile>_>.
    _M_t.
    super__Tuple_impl<0UL,_Imf_3_4::TiledInputFile_*,_std::default_delete<Imf_3_4::TiledInputFile>_>
    .super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false> =
         this_00.super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl !=
        (TiledInputFile *)0x0) {
      std::default_delete<Imf_3_4::TiledInputFile>::operator()
                ((default_delete<Imf_3_4::TiledInputFile> *)&peVar2->_tFile,
                 (TiledInputFile *)
                 __ptr.super__Head_base<0UL,_Imf_3_4::TiledInputFile_*,_false>._M_head_impl);
      return;
    }
    break;
  case EXR_STORAGE_DEEP_SCANLINE:
    this_02.super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>._M_head_impl =
         (_Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>)operator_new(0x20);
    DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)
               this_02.super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>._M_head_impl,
               peVar2->_part);
    __ptr_01.super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>._M_head_impl =
         (peVar2->_dsFile)._M_t.
         super___uniq_ptr_impl<Imf_3_4::DeepScanLineInputFile,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::DeepScanLineInputFile_*,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
         .super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>;
    (peVar2->_dsFile)._M_t.
    super___uniq_ptr_impl<Imf_3_4::DeepScanLineInputFile,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::DeepScanLineInputFile_*,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
    .super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false> =
         this_02.super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>._M_head_impl;
    if (__ptr_01.super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>._M_head_impl !=
        (DeepScanLineInputFile *)0x0) {
      std::default_delete<Imf_3_4::DeepScanLineInputFile>::operator()
                ((default_delete<Imf_3_4::DeepScanLineInputFile> *)&peVar2->_dsFile,
                 (DeepScanLineInputFile *)
                 __ptr_01.super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>.
                 _M_head_impl);
    }
    this_03.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl =
         (_Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>)operator_new(0x10);
    CompositeDeepScanLine::CompositeDeepScanLine
              ((CompositeDeepScanLine *)
               this_03.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl);
    peVar2 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    _Var3.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl =
         (peVar2->_compositor)._M_t.
         super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
         ._M_t.
         super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
         .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>;
    (peVar2->_compositor)._M_t.
    super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
    ._M_t.
    super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
    .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false> =
         this_03.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl;
    if (_Var3.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>._M_head_impl !=
        (CompositeDeepScanLine *)0x0) {
      (**(code **)(*(long *)_Var3.super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>.
                            _M_head_impl + 8))();
    }
    peVar2 = (this->_data).super___shared_ptr<Imf_3_4::InputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    CompositeDeepScanLine::addSource
              ((CompositeDeepScanLine *)
               (peVar2->_compositor)._M_t.
               super___uniq_ptr_impl<Imf_3_4::CompositeDeepScanLine,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::CompositeDeepScanLine_*,_std::default_delete<Imf_3_4::CompositeDeepScanLine>_>
               .super__Head_base<0UL,_Imf_3_4::CompositeDeepScanLine_*,_false>,
               (DeepScanLineInputFile *)
               (peVar2->_dsFile)._M_t.
               super___uniq_ptr_impl<Imf_3_4::DeepScanLineInputFile,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
               ._M_t.
               super__Tuple_impl<0UL,_Imf_3_4::DeepScanLineInputFile_*,_std::default_delete<Imf_3_4::DeepScanLineInputFile>_>
               .super__Head_base<0UL,_Imf_3_4::DeepScanLineInputFile_*,_false>);
    return;
  default:
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"Unable to handle data storage type in file \'",0x2c);
    pcVar5 = Context::fileName(&this->_ctxt);
    poVar6 = std::operator<<(local_190,pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
    this_04 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_04,local_1a0);
    __cxa_throw(this_04,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void
InputFile::initialize (void)
{
    int partidx;

    partidx = _data->getPartIdx ();
    _data->_storage = _ctxt.storage (partidx);

    // silly protection rules mean make_unique can't be used here
    if (_data->_storage == EXR_STORAGE_DEEP_SCANLINE)
    {
        _data->_dsFile.reset (new DeepScanLineInputFile (_data->_part));
        _data->_compositor = std::make_unique<CompositeDeepScanLine> ();
        _data->_compositor->addSource (_data->_dsFile.get ());
    }
    else if (
        _data->_storage == EXR_STORAGE_DEEP_TILED ||
        _data->_storage == EXR_STORAGE_TILED)
    {
        _data->_tFile.reset (new TiledInputFile (_data->_part));
    }
    else if (_data->_storage == EXR_STORAGE_SCANLINE)
    {
        _data->_sFile.reset (new ScanLineInputFile (_data->_part));
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to handle data storage type in file '" << fileName ()
                                                           << "'");
    }
}